

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_threads.c
# Opt level: O1

pthread_t * Curl_thread_create(_func_uint_void_ptr *func,void *arg)

{
  int iVar1;
  pthread_t *__newthread;
  undefined8 *__arg;
  
  __newthread = (pthread_t *)(*Curl_cmalloc)(8);
  __arg = (undefined8 *)(*Curl_cmalloc)(0x10);
  if (__newthread != (pthread_t *)0x0 && __arg != (undefined8 *)0x0) {
    *__arg = func;
    __arg[1] = arg;
    iVar1 = pthread_create(__newthread,(pthread_attr_t *)0x0,curl_thread_create_thunk,__arg);
    if (iVar1 == 0) {
      return __newthread;
    }
  }
  (*Curl_cfree)(__newthread);
  (*Curl_cfree)(__arg);
  return (pthread_t *)0x0;
}

Assistant:

curl_thread_t Curl_thread_create(unsigned int (*func) (void *), void *arg)
{
  curl_thread_t t = malloc(sizeof(pthread_t));
  struct curl_actual_call *ac = malloc(sizeof(struct curl_actual_call));
  if(!(ac && t))
    goto err;

  ac->func = func;
  ac->arg = arg;

  if(pthread_create(t, NULL, curl_thread_create_thunk, ac) != 0)
    goto err;

  return t;

err:
  free(t);
  free(ac);
  return curl_thread_t_null;
}